

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  double *pdVar2;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  DenseIndex DVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  Tools tools;
  float y_gt;
  float x_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ground_truth;
  float ro;
  float x;
  longlong timestamp;
  float vy_gt;
  float vx_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  estimations;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> measurement_pack_list;
  GroundTruthPackage gt_package;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> gt_pack_list;
  string line;
  string out_file_name_;
  string in_file_name_;
  FusionEKF fusionEKF;
  ofstream out_file_;
  ifstream in_file_;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_720;
  float local_700;
  float local_6fc;
  undefined1 local_6f8 [8];
  pointer pMStack_6f0;
  VectorXd local_6e8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  float local_6b4;
  pointer local_6b0;
  float local_6a4;
  float local_6a0;
  float local_69c;
  undefined1 local_698 [32];
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> local_678;
  value_type local_658;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> local_638;
  undefined1 *local_618;
  undefined8 local_610;
  undefined1 local_608 [16];
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [384];
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  long local_238 [65];
  
  check_arguments(argc,argv);
  std::__cxx11::string::string((string *)&local_5d8,argv[1],(allocator *)local_238);
  std::ifstream::ifstream(local_238,local_5d8._M_dataplus._M_p,_S_in);
  std::__cxx11::string::string((string *)&local_5f8,argv[2],(allocator *)&local_438);
  std::ofstream::ofstream(&local_438,local_5f8._M_dataplus._M_p,_S_out);
  check_files((ifstream *)local_238,&local_5d8,(ofstream *)&local_438,&local_5f8);
  local_678.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618 = local_608;
  local_610 = 0;
  local_608[0] = 0;
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                            (char)(ifstream *)local_238);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_618,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    local_698._0_8_ = local_698 + 0x10;
    local_698._8_8_ = (pointer)0x0;
    local_698._16_8_ = local_698._16_8_ & 0xffffffffffffff00;
    local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_5b8,(string *)&local_618,_S_in);
    std::operator>>((istream *)local_5b8,(string *)local_698);
    iVar6 = std::__cxx11::string::compare((char *)local_698);
    if (iVar6 == 0) {
      pMStack_6f0 = (pointer)((ulong)pMStack_6f0 & 0xffffffff00000000);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_720,2,2,1);
      DVar4 = local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar2 = local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pMVar3 = local_720.m_xpr;
      local_720.m_xpr =
           (Matrix<double,__1,_1,_0,__1,_1> *)
           local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)pMVar3;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           local_720.m_row;
      local_720.m_row = DVar4;
      free(pdVar2);
      std::istream::_M_extract<float>((float *)local_5b8);
      std::istream::_M_extract<float>((float *)local_5b8);
      local_720.m_xpr = &local_6e8;
      local_720.m_row = 0;
      local_720.m_col = 1;
      local_720.m_currentBlockRows = 1;
      (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
       local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)->
      m_storage).m_data = (double *)(double)local_6c8._0_4_;
      local_6c0 = (double)local_6d0._0_4_;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (&local_720,&local_6c0);
      if ((local_720.m_row + local_720.m_currentBlockRows !=
           ((local_720.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_rows) || (local_720.m_col != 1)) goto LAB_0010fbf3;
      std::istream::_M_extract<long_long>((longlong *)local_5b8);
      local_6f8 = (undefined1  [8])local_6b0;
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                (&local_678,(value_type *)local_6f8);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_698);
      if (iVar6 == 0) {
        pMStack_6f0 = (pointer)CONCAT44(pMStack_6f0._4_4_,1);
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_720,3,3,1);
        DVar4 = local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        pdVar2 = local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pMVar3 = local_720.m_xpr;
        local_720.m_xpr =
             (Matrix<double,__1,_1,_0,__1,_1> *)
             local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pMVar3;
        local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             local_720.m_row;
        local_720.m_row = DVar4;
        free(pdVar2);
        std::istream::_M_extract<float>((float *)local_5b8);
        std::istream::_M_extract<float>((float *)local_5b8);
        std::istream::_M_extract<float>((float *)local_5b8);
        local_720.m_xpr = &local_6e8;
        local_720.m_row = 0;
        local_720.m_col = 1;
        local_720.m_currentBlockRows = 1;
        (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ->m_storage).m_data = (double *)(double)local_6d0._0_4_;
        local_6c0 = (double)local_6fc;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (&local_720,&local_6c0);
        local_6c8 = (double)local_700;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar8,&local_6c8);
        if ((local_720.m_row + local_720.m_currentBlockRows !=
             ((local_720.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) || (local_720.m_col != 1)) goto LAB_0010fbf3;
        std::istream::_M_extract<long_long>((longlong *)local_5b8);
        local_6f8 = (undefined1  [8])local_6b0;
        std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                  (&local_678,(value_type *)local_6f8);
      }
    }
    std::istream::_M_extract<float>((float *)local_5b8);
    std::istream::_M_extract<float>((float *)local_5b8);
    std::istream::_M_extract<float>((float *)local_5b8);
    std::istream::_M_extract<float>((float *)local_5b8);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_720,4,4,1);
    DVar4 = local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    pdVar2 = local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pMVar3 = local_720.m_xpr;
    local_720.m_xpr =
         (Matrix<double,__1,_1,_0,__1,_1> *)
         local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data;
    local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)pMVar3;
    local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_720.m_row;
    local_720.m_row = DVar4;
    free(pdVar2);
    local_720.m_xpr = &local_658.gt_values_;
    local_720.m_row = 0;
    local_720.m_col = 1;
    local_720.m_currentBlockRows = 1;
    (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
     local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
     m_data)->m_storage).m_data = (double *)(double)local_6fc;
    local_6c0 = (double)local_700;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_720,&local_6c0);
    local_6c8 = (double)local_69c;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar8,&local_6c8);
    local_6d0 = (double)local_6a0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar8,&local_6d0);
    if ((local_720.m_row + local_720.m_currentBlockRows !=
         ((local_720.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_rows) || (local_720.m_col != 1)) {
LAB_0010fbf3:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::push_back
              (&local_638,&local_658);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_5b8);
    std::ios_base::~ios_base((ios_base *)(local_5b8 + 0x78));
    free(local_658.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if ((pointer)local_698._0_8_ != (pointer)(local_698 + 0x10)) {
      operator_delete((void *)local_698._0_8_);
    }
  }
  FusionEKF::FusionEKF((FusionEKF *)local_5b8);
  local_698._0_8_ = (pointer)0x0;
  local_698._8_8_ = (pointer)0x0;
  local_698._16_8_ = (pointer)0x0;
  local_6e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_6f8 = (undefined1  [8])0x0;
  pMStack_6f0 = (pointer)0x0;
  if ((long)local_678.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_678.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    lVar11 = (long)local_678.
                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_678.
                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    lVar10 = 0;
    do {
      FusionEKF::ProcessMeasurement
                ((FusionEKF *)local_5b8,
                 (MeasurementPackage *)
                 ((long)&(local_678.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar10));
      if ((long)local_5b8._24_8_ < 1) {
LAB_0010fbd4:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      poVar9 = std::ostream::_M_insert<double>(*(double *)local_5b8._16_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if ((long)local_5b8._24_8_ < 2) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>(*(double *)(local_5b8._16_8_ + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if ((long)local_5b8._24_8_ < 3) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>(*(double *)(local_5b8._16_8_ + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if ((long)local_5b8._24_8_ < 4) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>(*(double *)(local_5b8._16_8_ + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      iVar6 = *(int *)((long)&(local_678.
                               super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                               ._M_impl.super__Vector_impl_data._M_start)->sensor_type_ + lVar10);
      if (iVar6 == 1) {
        lVar1 = *(long *)((long)&((local_678.
                                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->raw_measurements_).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows + lVar10);
        if ((lVar1 < 1) || (lVar1 == 1)) goto LAB_0010fbd4;
        pdVar2 = *(double **)
                  ((long)&((local_678.
                            super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                            ._M_impl.super__Vector_impl_data._M_start)->raw_measurements_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar10);
        local_6b4 = (float)*pdVar2;
        local_6a4 = (float)pdVar2[1];
        fVar12 = cosf(local_6a4);
        poVar9 = std::ostream::_M_insert<double>((double)(fVar12 * local_6b4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
        fVar12 = sinf(local_6a4);
        poVar9 = std::ostream::_M_insert<double>((double)(fVar12 * local_6b4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      }
      else if (iVar6 == 0) {
        if (*(long *)((long)&((local_678.
                               super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                               ._M_impl.super__Vector_impl_data._M_start)->raw_measurements_).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + lVar10) < 1) goto LAB_0010fbd4;
        poVar9 = std::ostream::_M_insert<double>
                           (**(double **)
                              ((long)&((local_678.
                                        super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      raw_measurements_).
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
        if (*(long *)((long)&((local_678.
                               super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                               ._M_impl.super__Vector_impl_data._M_start)->raw_measurements_).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + lVar10) < 2) goto LAB_0010fbd4;
        poVar9 = std::ostream::_M_insert<double>
                           (*(double *)
                             (*(long *)((long)&((local_678.
                                                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               raw_measurements_).
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar10) + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      }
      if (*(long *)((long)&((local_638.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows + lVar10) < 1) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>
                         (**(double **)
                            ((long)&((local_638.
                                      super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data + lVar10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if (*(long *)((long)&((local_638.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows + lVar10) < 2) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)((long)&((local_638.
                                               super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             gt_values_).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_data + lVar10) + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if (*(long *)((long)&((local_638.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows + lVar10) < 3) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)((long)&((local_638.
                                               super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             gt_values_).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_data + lVar10) + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      if (*(long *)((long)&((local_638.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows + lVar10) < 4) goto LAB_0010fbd4;
      poVar9 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)((long)&((local_638.
                                               super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             gt_values_).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_data + lVar10) + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_698,(value_type *)(local_5b8 + 0x10));
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_6f8,
                  (value_type *)
                  ((long)&((local_638.
                            super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                            ._M_impl.super__Vector_impl_data._M_start)->gt_values_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar10));
      lVar10 = lVar10 + 0x20;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  Tools::Tools((Tools *)&local_720);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Accuracy - RMSE:",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  poVar9 = (ostream *)std::ostream::flush();
  Tools::CalculateRMSE
            ((Tools *)&local_658,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_720,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_698);
  poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_658
                            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  free((void *)local_658.timestamp_);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ofstream::close();
  }
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ifstream::close();
  }
  Tools::~Tools((Tools *)&local_720);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)local_6f8);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)local_698);
  FusionEKF::~FusionEKF((FusionEKF *)local_5b8);
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::~vector(&local_638);
  std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::~vector(&local_678);
  local_438 = _VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_430);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  check_arguments(argc, argv);

  string in_file_name_ = argv[1];
  ifstream in_file_(in_file_name_.c_str(), ifstream::in);

  string out_file_name_ = argv[2];
  ofstream out_file_(out_file_name_.c_str(), ofstream::out);

  check_files(in_file_, in_file_name_, out_file_, out_file_name_);

  vector<MeasurementPackage> measurement_pack_list;
  vector<GroundTruthPackage> gt_pack_list;

  string line;

  // prep the measurement packages (each line represents a measurement at a
  // timestamp)
  while (getline(in_file_, line)) {

    string sensor_type;
    MeasurementPackage meas_package;
    GroundTruthPackage gt_package;
    istringstream iss(line);
    long long timestamp;

    // reads first element from the current line
    iss >> sensor_type;
    if (sensor_type.compare("L") == 0) {
      // LASER MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::LASER;
      meas_package.raw_measurements_ = VectorXd(2);
      float x;
      float y;
      iss >> x;
      iss >> y;
      meas_package.raw_measurements_ << x, y;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    } else if (sensor_type.compare("R") == 0) {
      // RADAR MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::RADAR;
      meas_package.raw_measurements_ = VectorXd(3);
      float ro;
      float phi;
      float ro_dot;
      iss >> ro;
      iss >> phi;
      iss >> ro_dot;
      meas_package.raw_measurements_ << ro, phi, ro_dot;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    }

    // read ground truth data to compare later
    float x_gt;
    float y_gt;
    float vx_gt;
    float vy_gt;
    iss >> x_gt;
    iss >> y_gt;
    iss >> vx_gt;
    iss >> vy_gt;
    gt_package.gt_values_ = VectorXd(4);
    gt_package.gt_values_ << x_gt, y_gt, vx_gt, vy_gt;
    gt_pack_list.push_back(gt_package);
  }

  // Create a Fusion EKF instance
  FusionEKF fusionEKF;

  // used to compute the RMSE later
  vector<VectorXd> estimations;
  vector<VectorXd> ground_truth;

  //Call the EKF-based fusion
  size_t N = measurement_pack_list.size();
  for (size_t k = 0; k < N; ++k) {
    // start filtering from the second frame (the speed is unknown in the first
    // frame)
    fusionEKF.ProcessMeasurement(measurement_pack_list[k]);

    // output the estimation
    out_file_ << fusionEKF.ekf_.x_(0) << "\t";
    out_file_ << fusionEKF.ekf_.x_(1) << "\t";
    out_file_ << fusionEKF.ekf_.x_(2) << "\t";
    out_file_ << fusionEKF.ekf_.x_(3) << "\t";

    // output the measurements
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      // output the estimation
      out_file_ << measurement_pack_list[k].raw_measurements_(0) << "\t";
      out_file_ << measurement_pack_list[k].raw_measurements_(1) << "\t";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      // output the estimation in the cartesian coordinates
      float ro = measurement_pack_list[k].raw_measurements_(0);
      float phi = measurement_pack_list[k].raw_measurements_(1);
      out_file_ << ro * cos(phi) << "\t"; // p1_meas
      out_file_ << ro * sin(phi) << "\t"; // ps_meas
    }

    // output the ground truth packages
    out_file_ << gt_pack_list[k].gt_values_(0) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(1) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(2) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(3) << "\n";

    estimations.push_back(fusionEKF.ekf_.x_);
    ground_truth.push_back(gt_pack_list[k].gt_values_);
  }

  // compute the accuracy (RMSE)
  Tools tools;
  cout << "Accuracy - RMSE:" << endl << tools.CalculateRMSE(estimations, ground_truth) << endl;

  // close files
  if (out_file_.is_open()) {
    out_file_.close();
  }

  if (in_file_.is_open()) {
    in_file_.close();
  }

  return 0;
}